

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::CentroidRenderCase::setupRenderData
          (CentroidRenderCase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  void *__s;
  mapped_type *pmVar3;
  undefined8 *puVar4;
  long lVar5;
  float fVar6;
  key_type local_60;
  float local_40;
  float local_3c;
  float local_38;
  
  iVar2 = (*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  __s = operator_new(0x7080);
  memset(__s,0,0x7080);
  (this->super_MultisampleRenderCase).m_renderMode = 4;
  (this->super_MultisampleRenderCase).m_renderCount = 600;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_MultisampleRenderCase).m_renderSceneDescription,0,
             (char *)(this->super_MultisampleRenderCase).m_renderSceneDescription._M_string_length,
             0x9605b4);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_position","");
  this_00 = &(this->super_MultisampleRenderCase).m_renderAttribs;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->offset = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_position","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->stride = 0x30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_barycentricsA","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->offset = 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_barycentricsA","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->stride = 0x30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_barycentricsB","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->offset = 0x20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a_barycentricsB","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_60);
  pmVar3->stride = 0x30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  puVar4 = (undefined8 *)((long)__s + 0x88);
  lVar5 = 0;
  do {
    fVar6 = (float)(int)lVar5 / 200.0;
    local_3c = (fVar6 + fVar6) * 3.1415927;
    fVar6 = ((float)(int)lVar5 + 1.0) / 200.0;
    local_40 = (fVar6 + fVar6) * 3.1415927;
    puVar4[-0x11] = 0xbe99999a3e4ccccd;
    puVar4[-0x10] = 0x3f80000000000000;
    puVar4[-0xf] = 0x3f800000;
    puVar4[-0xe] = 0;
    puVar4[-0xd] = 0x3f800000;
    puVar4[-0xc] = 0;
    local_38 = cosf(local_3c);
    fVar6 = sinf(local_3c);
    puVar4[-0xb] = CONCAT44(fVar6 + fVar6,local_38 + local_38);
    puVar4[-10] = 0x3f80000000000000;
    puVar4[-9] = 0x3f80000000000000;
    puVar4[-8] = 0;
    puVar4[-7] = 0x3f80000000000000;
    puVar4[-6] = 0;
    local_38 = cosf(local_40);
    fVar6 = sinf(local_40);
    puVar4[-5] = CONCAT44(fVar6 + fVar6,local_38 + local_38);
    puVar4[-4] = 0x3f80000000000000;
    puVar4[-3] = 0;
    puVar4[-2] = 0x3f800000;
    puVar4[-1] = 0;
    *puVar4 = 0x3f800000;
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 0x12;
  } while (lVar5 != 200);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x40))
            (0x8892,(this->super_MultisampleRenderCase).m_buffer);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x150))(0x8892,0x7080,__s,0x88e4);
  operator_delete(__s,0x7080);
  return;
}

Assistant:

void CentroidRenderCase::setupRenderData (void)
{
	const int				numTriangles	= 200;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data			(numTriangles * 3 * 3);

	m_renderMode = GL_TRIANGLES;
	m_renderCount = numTriangles * 3;
	m_renderSceneDescription = "triangle fan of narrow triangles";

	m_renderAttribs["a_position"].offset = 0;
	m_renderAttribs["a_position"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsA"].offset = (int)sizeof(float[4]);
	m_renderAttribs["a_barycentricsA"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsB"].offset = (int)sizeof(float[4]) * 2;
	m_renderAttribs["a_barycentricsB"].stride = (int)sizeof(float[4]) * 3;

	for (int triangleNdx = 0; triangleNdx < numTriangles; ++triangleNdx)
	{
		const float angle		= ((float)triangleNdx) / (float)numTriangles * 2.0f * DE_PI;
		const float nextAngle	= ((float)triangleNdx + 1.0f) / (float)numTriangles * 2.0f * DE_PI;

		data[(triangleNdx * 3 + 0) * 3 + 0] = tcu::Vec4(0.2f, -0.3f, 0.0f, 1.0f);
		data[(triangleNdx * 3 + 0) * 3 + 1] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 0) * 3 + 2] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 1) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(angle), 2.0f * deFloatSin(angle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 1) * 3 + 1] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 1) * 3 + 2] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 2) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(nextAngle), 2.0f * deFloatSin(nextAngle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 2) * 3 + 1] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
		data[(triangleNdx * 3 + 2) * 3 + 2] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
	}

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(data.size() * sizeof(tcu::Vec4)), data[0].getPtr(), GL_STATIC_DRAW);
}